

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

char * __thiscall
cmLocalGenerator::GetFeature(cmLocalGenerator *this,string *feature,string *config)

{
  char *pcVar1;
  string featureConfig;
  string local_60;
  string local_40;
  
  if (config->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_60,(string *)feature);
    std::__cxx11::string::append((char *)&local_60);
    cmsys::SystemTools::UpperCase(&local_40,config);
    std::__cxx11::string::append((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    pcVar1 = cmMakefile::GetProperty(this->Makefile,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
  }
  pcVar1 = cmMakefile::GetProperty(this->Makefile,feature);
  if (pcVar1 == (char *)0x0) {
    if (this->Parent == (cmLocalGenerator *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = GetFeature(this->Parent,feature,config);
    }
  }
  return pcVar1;
}

Assistant:

const char* cmLocalGenerator::GetFeature(const std::string& feature,
                                         const std::string& config)
{
  // TODO: Define accumulation policy for features (prepend, append, replace).
  // Currently we always replace.
  if(!config.empty())
    {
    std::string featureConfig = feature;
    featureConfig += "_";
    featureConfig += cmSystemTools::UpperCase(config);
    if(const char* value = this->Makefile->GetProperty(featureConfig))
      {
      return value;
      }
    }
  if(const char* value = this->Makefile->GetProperty(feature))
    {
    return value;
    }
  if(cmLocalGenerator* parent = this->GetParent())
    {
    return parent->GetFeature(feature, config);
    }
  return 0;
}